

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_belief.cpp
# Opt level: O1

vector<despot::State_*,_std::allocator<despot::State_*>_> *
despot::ParticleBelief::Resample
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,int num
          ,vector<despot::State_*,_std::allocator<despot::State_*>_> *belief,DSPOMDP *model,
          History *history,int hstart)

{
  pointer *pppSVar1;
  iterator __position;
  pointer ppSVar2;
  bool bVar3;
  double dVar4;
  State *pSVar5;
  DSPOMDP *pDVar6;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  pointer ppSVar9;
  log_ostream *plVar10;
  ostream *poVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar20;
  double dVar21;
  State *particle;
  OBS_TYPE obs;
  double reward;
  double local_a0;
  State *local_88;
  double local_80;
  int local_78;
  int local_74;
  ulong local_70;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *local_68;
  double local_60;
  double local_58;
  DSPOMDP *local_50;
  double local_48;
  undefined1 local_40 [8];
  undefined1 local_38 [8];
  
  local_48 = 1.0 / (double)num;
  dVar21 = Random::NextDouble((Random *)&Random::RANDOM,0.0,local_48);
  local_60 = (*(belief->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
               _M_impl.super__Vector_impl_data._M_start)->weight;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_80 = -INFINITY;
  local_68 = belief;
  if (0 < num) {
    local_78 = num * 200;
    local_70 = (ulong)hstart;
    iVar14 = 0;
    iVar7 = 0;
    iVar12 = 0;
    local_50 = model;
    do {
      pDVar6 = local_50;
      if (local_60 < dVar21) {
        ppSVar9 = (local_68->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          iVar14 = iVar14 + 1;
          if ((long)(local_68->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar9 >> 3 == (long)iVar14
             ) {
            iVar14 = 0;
          }
          local_60 = local_60 + ppSVar9[iVar14]->weight;
        } while (local_60 < dVar21);
      }
      local_74 = iVar7;
      local_58 = dVar21;
      iVar7 = (*local_50->_vptr_DSPOMDP[0x16])
                        (local_50,(local_68->
                                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[iVar14]);
      local_88 = (State *)CONCAT44(extraout_var,iVar7);
      local_a0 = 0.0;
      if (local_70 <
          (ulong)((long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(history->actions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2)) {
        local_a0 = 0.0;
        uVar15 = local_70;
        do {
          pSVar5 = local_88;
          dVar21 = Random::NextDouble((Random *)&Random::RANDOM);
          (*pDVar6->_vptr_DSPOMDP[2])
                    (SUB84(dVar21,0),pDVar6,pSVar5,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15],local_38,local_40
                    );
          (*pDVar6->_vptr_DSPOMDP[7])
                    (pDVar6,(history->observations_).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar15],local_88,
                     (ulong)(uint)(history->actions_).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar15]);
          if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) < 0.0 ||
              (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) == 0.0) {
            (*pDVar6->_vptr_DSPOMDP[0x17])(pDVar6,local_88);
          }
          else {
            dVar21 = log((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
            local_a0 = local_a0 + dVar21;
          }
        } while ((0.0 <= (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) &&
                  (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) != 0.0) &&
                (uVar15 = uVar15 + 1,
                uVar15 < (ulong)((long)(history->actions_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 (long)(history->actions_).
                                       super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_start >> 2)));
      }
      if ((local_88->super_MemoryObject).allocated_ == true) {
        local_88->weight = local_a0;
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<despot::State*,std::allocator<despot::State*>>::
          _M_realloc_insert<despot::State*const&>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)__return_storage_ptr__
                     ,__position,&local_88);
        }
        else {
          *__position._M_current = local_88;
          pppSVar1 = &(__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          *pppSVar1 = *pppSVar1 + 1;
        }
        iVar12 = iVar12 + 1;
        uVar19 = SUB84(local_80,0);
        uVar20 = (int)((ulong)local_80 >> 0x20);
        if (local_80 <= local_a0) {
          uVar19 = SUB84(local_a0,0);
          uVar20 = (int)((ulong)local_a0 >> 0x20);
        }
        local_80 = (double)CONCAT44(uVar20,uVar19);
      }
      local_a0._0_4_ = iVar12;
      if ((iVar12 == num) &&
         (uVar8 = (int)((ulong)((long)(__return_storage_ptr__->
                                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(__return_storage_ptr__->
                                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start) >> 3) - 1,
         -1 < (int)uVar8)) {
        uVar15 = (ulong)uVar8;
        uVar18 = uVar15 * 8 ^ 0xfffffffffffffff8;
        lVar13 = uVar15 * 8 + 8;
        lVar16 = uVar15 + 1;
        do {
          dVar21 = (__return_storage_ptr__->
                   super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[lVar16 + -1]->weight - local_80;
          dVar4 = log(local_48);
          if (dVar21 < dVar4) {
            (*local_50->_vptr_DSPOMDP[0x17])
                      (local_50,(__return_storage_ptr__->
                                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                )._M_impl.super__Vector_impl_data._M_start[lVar16 + -1]);
            ppSVar9 = (__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            ppSVar2 = (__return_storage_ptr__->
                      super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
            if ((pointer)((long)ppSVar9 + lVar13) != ppSVar2) {
              memmove(ppSVar9 + lVar16 + -1,ppSVar9 + lVar16,
                      (long)ppSVar2 + (uVar18 - (long)ppSVar9));
            }
            pppSVar1 = &(__return_storage_ptr__->
                        super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppSVar1 = *pppSVar1 + -1;
            local_a0._0_4_ = local_a0._0_4_ + -1;
          }
          uVar18 = uVar18 + 8;
          lVar13 = lVar13 + -8;
          lVar17 = lVar16 + -1;
          bVar3 = 0 < lVar16;
          lVar16 = lVar17;
        } while (lVar17 != 0 && bVar3);
      }
      if (num <= local_a0._0_4_) break;
      iVar7 = local_74 + 1;
      dVar21 = local_58 + local_48;
      iVar12 = local_a0._0_4_;
    } while (iVar7 < local_78);
  }
  ppSVar9 = (__return_storage_ptr__->
            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish == ppSVar9) {
    uVar15 = 0;
    dVar21 = 0.0;
  }
  else {
    dVar21 = 0.0;
    uVar18 = 0;
    do {
      dVar4 = exp(ppSVar9[uVar18]->weight - local_80);
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start[uVar18]->weight = dVar4;
      dVar21 = dVar21 + dVar4;
      uVar18 = uVar18 + 1;
      ppSVar9 = (__return_storage_ptr__->
                super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
      uVar15 = (long)(__return_storage_ptr__->
                     super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)ppSVar9 >> 3;
    } while (uVar18 < uVar15);
  }
  if (uVar15 != 0) {
    uVar18 = 0;
    do {
      ppSVar9[uVar18]->weight = ppSVar9[uVar18]->weight / dVar21;
      uVar18 = uVar18 + 1;
    } while (uVar15 != uVar18);
  }
  iVar12 = logging::level();
  if ((0 < iVar12) && (iVar12 = logging::level(), 3 < iVar12)) {
    plVar10 = logging::stream(4);
    std::__ostream_insert<char,std::char_traits<char>>
              (&plVar10->super_ostream,"[Belief::Resample] Resampled ",0x1d);
    poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)plVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," particles",10);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_finish !=
      (__return_storage_ptr__->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    uVar15 = 0;
    do {
      iVar12 = logging::level();
      if ((0 < iVar12) && (iVar12 = logging::level(), 4 < iVar12)) {
        plVar10 = logging::stream(5);
        std::__ostream_insert<char,std::char_traits<char>>(&plVar10->super_ostream," ",1);
        poVar11 = (ostream *)std::ostream::operator<<(plVar10,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
        poVar11 = despot::operator<<(poVar11,(__return_storage_ptr__->
                                             super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start[uVar15]);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 < (ulong)((long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(__return_storage_ptr__->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> ParticleBelief::Resample(int num, const vector<State*>& belief,
	const DSPOMDP* model, History history, int hstart) {
	double unit = 1.0 / num;
	double mass = Random::RANDOM.NextDouble(0, unit);
	int pos = 0;
	double cur = belief[0]->weight;

	double reward;
	OBS_TYPE obs;

	vector<State*> sample;
	int count = 0;
	double max_wgt = Globals::NEG_INFTY;
	int trial = 0;
	while (count < num && trial < 200 * num) {
		// Pick next particle
		while (mass > cur) {
			pos++;
			if (pos == belief.size())
				pos = 0;

			cur += belief[pos]->weight;
		}
		trial++;

		mass += unit;

		State* particle = model->Copy(belief[pos]);

		// Step through history
		double log_wgt = 0;
		for (int i = hstart; i < history.Size(); i++) {
			model->Step(*particle, Random::RANDOM.NextDouble(),
				history.Action(i), reward, obs);

			double prob = model->ObsProb(history.Observation(i), *particle,
				history.Action(i));
			if (prob > 0) {
				log_wgt += log(prob);
			} else {
				model->Free(particle);
				break;
			}
		}

		// Add to sample if survived
		if (particle->IsAllocated()) {
			count++;

			particle->weight = log_wgt;
			sample.push_back(particle);

			max_wgt = max(log_wgt, max_wgt);
		}

		// Remove particles with very small weights
		if (count == num) {
			for (int i = sample.size() - 1; i >= 0; i--)
				if (sample[i]->weight - max_wgt < log(1.0 / num)) {
					model->Free(sample[i]);
					sample.erase(sample.begin() + i);
					count--;
				}
		}
	}

	double total_weight = 0;
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = exp(sample[i]->weight - max_wgt);
		total_weight += sample[i]->weight;
	}
	for (int i = 0; i < sample.size(); i++) {
		sample[i]->weight = sample[i]->weight / total_weight;
	}

	logd << "[Belief::Resample] Resampled " << sample.size() << " particles"
		<< endl;
	for (int i = 0; i < sample.size(); i++) {
		logv << " " << i << " = " << *sample[i] << endl;
	}

	return sample;
}